

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

int new_shutdown_condition(EVclient client,CMConnection conn)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  piVar3 = client->shutdown_conditions;
  if (piVar3 == (int *)0x0) {
    piVar3 = (int *)INT_CMmalloc(8);
    lVar4 = 0;
  }
  else {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      lVar1 = lVar4 + 1;
    } while (piVar3[lVar4] != -1);
    piVar3 = (int *)INT_CMrealloc(piVar3,lVar4 * 4 + 8U & 0x3fffffffc);
  }
  client->shutdown_conditions = piVar3;
  iVar2 = INT_CMCondition_get(client->cm,conn);
  piVar3 = client->shutdown_conditions;
  piVar3[lVar4] = iVar2;
  piVar3[lVar4 + 1] = -1;
  return iVar2;
}

Assistant:

static int
new_shutdown_condition(EVclient client, CMConnection conn)
{
    int cur_count = 0;
    if (client->shutdown_conditions == NULL) {
	client->shutdown_conditions = malloc(2*sizeof(client->shutdown_conditions[0]));
    } else {
	while (client->shutdown_conditions[cur_count++] != -1) ; 
	cur_count--;
	client->shutdown_conditions = realloc(client->shutdown_conditions, 
					   (cur_count+2)*sizeof(client->shutdown_conditions[0]));
    }
    client->shutdown_conditions[cur_count] = INT_CMCondition_get(client->cm, conn);
    client->shutdown_conditions[cur_count+1] = -1;
    return client->shutdown_conditions[cur_count];
}